

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f851::MapDrivePlugIn::printMiniHelpForFunctionKeys(MapDrivePlugIn *this)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ostringstream message;
  char local_189;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  char *__s;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Function keys handled by ",0x19);
  local_189 = '\"';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,&local_189,1);
  iVar1 = (*(this->super_PlugIn).super_AbstractPlugIn._vptr_AbstractPlugIn[7])(this);
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  }
  local_189 = '\"';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_189,1);
  local_189 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_189,1);
  std::ostream::put((char)poVar2);
  OpenSteer::OpenSteerDemo::printMessage((ostringstream *)local_188);
  OpenSteer::OpenSteerDemo::printMessage("  F1     select next driving demo.");
  OpenSteer::OpenSteerDemo::printMessage("  F2     reverse path following direction.");
  OpenSteer::OpenSteerDemo::printMessage("  F3     toggle path fences.");
  OpenSteer::OpenSteerDemo::printMessage("  F4     toggle random rock clumps.");
  OpenSteer::OpenSteerDemo::printMessage("  F5     toggle curved prediction.");
  OpenSteer::OpenSteerDemo::printMessage("");
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void printMiniHelpForFunctionKeys (void)
        {
            std::ostringstream message;
            message << "Function keys handled by ";
            message << '"' << name() << '"' << ':' << std::ends;
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage ("  F1     select next driving demo.");
            OpenSteerDemo::printMessage ("  F2     reverse path following direction.");
            OpenSteerDemo::printMessage ("  F3     toggle path fences.");
            OpenSteerDemo::printMessage ("  F4     toggle random rock clumps.");
            OpenSteerDemo::printMessage ("  F5     toggle curved prediction.");
            OpenSteerDemo::printMessage ("");
        }